

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Vec_Int_t * Llb_Nonlin4CreateOrder(Aig_Man_t *pAig)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  uint uVar4;
  Vec_Int_t *vOrder;
  int *__s;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int Counter;
  int local_2c;
  
  __s = (int *)0x0;
  local_2c = 0;
  iVar7 = pAig->vObjs->nSize;
  vOrder = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar5 = iVar7;
  }
  vOrder->nSize = 0;
  vOrder->nCap = iVar5;
  if (iVar5 != 0) {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  vOrder->pArray = __s;
  vOrder->nSize = iVar7;
  memset(__s,0xff,(long)iVar7 << 2);
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  if (0 < pAig->nRegs) {
    iVar7 = 0;
    do {
      uVar4 = pAig->nTruePos + iVar7;
      if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar4];
      iVar5 = *(int *)((long)pvVar1 + 0x24);
      if (((long)iVar5 < 0) || (vOrder->nSize <= iVar5)) {
        local_2c = local_2c + 1;
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vOrder->pArray[iVar5] = local_2c;
      local_2c = local_2c + 1;
      Llb_Nonlin4CreateOrder_rec
                (pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),vOrder,
                 &local_2c);
      iVar7 = iVar7 + 1;
    } while (iVar7 < pAig->nRegs);
  }
  pVVar2 = pAig->vCis;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar6 = 0;
    do {
      iVar7 = *(int *)((long)ppvVar3[lVar6] + 0x24);
      lVar8 = (long)iVar7;
      if ((lVar8 < 0) || (vOrder->nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vOrder->pArray[lVar8] < 0) {
        vOrder->pArray[lVar8] = local_2c;
        local_2c = local_2c + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar2->nSize);
  }
  if (local_2c <= pAig->nRegs + pAig->nObjs[2]) {
    Aig_ManCleanMarkA(pAig);
    return vOrder;
  }
  __assert_fail("Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Nonlin.c"
                ,0x178,"Vec_Int_t *Llb_Nonlin4CreateOrder(Aig_Man_t *)");
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrder( Aig_Man_t * pAig )
{
    Vec_Int_t * vNodes = NULL;
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
/*
    // mark internal nodes to be used
    Aig_ManCleanMarkA( pAig );
    vNodes = Llb_Nonlin4CollectHighRefNodes( pAig, 4 );
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        pObj->fMarkA = 1;
printf( "Techmapping added %d pivots.\n", Vec_IntSize(vNodes) );
*/
    // collect nodes in the order
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        Llb_Nonlin4CreateOrder_rec( pAig, Aig_ObjFanin0(pObj), vOrder, &Counter );
    }
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) < 0 )
        {
//            if ( Saig_ObjIsLo(pAig, pObj) )
//                Vec_IntWriteEntry( vOrder, Aig_ObjId(Saig_ObjLoToLi(pAig, pObj)), Counter++ );
            Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        }
    assert( Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0) );
    Aig_ManCleanMarkA( pAig );
    Vec_IntFreeP( &vNodes );
    return vOrder;
}